

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::output_adapter(output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,basic_ostream<char,_std::char_traits<char>_> *s)

{
  shared_ptr<nlohmann::detail::output_stream_adapter<char>_> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000008;
  shared_ptr<nlohmann::detail::output_adapter_protocol<char>_> *in_stack_ffffffffffffffe0;
  
  std::make_shared<nlohmann::detail::output_stream_adapter<char>,std::ostream&>(in_stack_00000008);
  std::shared_ptr<nlohmann::detail::output_adapter_protocol<char>>::
  shared_ptr<nlohmann::detail::output_stream_adapter<char>,void>(in_stack_ffffffffffffffe0,in_RDI);
  std::shared_ptr<nlohmann::detail::output_stream_adapter<char>_>::~shared_ptr
            ((shared_ptr<nlohmann::detail::output_stream_adapter<char>_> *)0x262a1e);
  return;
}

Assistant:

output_adapter(std::basic_ostream<CharType>& s)
        : oa(std::make_shared<output_stream_adapter<CharType>>(s)) {}